

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManLevel_rec(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Nwk_Obj_t *pObj_00;
  bool bVar4;
  int local_34;
  int LevelMax;
  int nTerms;
  int iTerm1;
  int iBox;
  int i;
  Nwk_Obj_t *pNext;
  Tim_Man_t *pManTime;
  Nwk_Obj_t *pObj_local;
  
  p = pObj->pMan->pManTime;
  local_34 = 0;
  iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pObj);
    iVar1 = Nwk_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsNode(pObj);
      if ((iVar1 == 0) && (iVar1 = Nwk_ObjIsCo(pObj), iVar1 == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,200,"void Nwk_ManLevel_rec(Nwk_Obj_t *)");
      }
      iTerm1 = 0;
      while( true ) {
        bVar4 = false;
        if (iTerm1 < pObj->nFanins) {
          _iBox = pObj->pFanio[iTerm1];
          bVar4 = _iBox != (Nwk_Obj_t *)0x0;
        }
        if (!bVar4) break;
        Nwk_ManLevel_rec(_iBox);
        iVar1 = Nwk_ObjLevel(_iBox);
        if (local_34 < iVar1) {
          local_34 = Nwk_ObjLevel(_iBox);
        }
        iTerm1 = iTerm1 + 1;
      }
      iVar1 = Nwk_ObjIsNode(pObj);
      if ((iVar1 != 0) && (iVar1 = Nwk_ObjFaninNum(pObj), 0 < iVar1)) {
        local_34 = local_34 + 1;
      }
    }
    else if ((p != (Tim_Man_t *)0x0) &&
            (iVar1 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7), -1 < iVar1)) {
      iVar2 = Tim_ManBoxInputFirst(p,iVar1);
      iVar1 = Tim_ManBoxInputNum(p,iVar1);
      for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
        pObj_00 = Nwk_ManCo(pObj->pMan,iVar2 + iTerm1);
        Nwk_ManLevel_rec(pObj_00);
        iVar3 = Nwk_ObjLevel(pObj_00);
        if (local_34 < iVar3) {
          local_34 = Nwk_ObjLevel(pObj_00);
        }
      }
      local_34 = local_34 + 1;
    }
    Nwk_ObjSetLevel(pObj,local_34);
  }
  return;
}

Assistant:

void Nwk_ManLevel_rec( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCi(pObj) )
    {
        if ( pManTime ) 
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Nwk_ManLevel_rec( pNext );
                    if ( LevelMax < Nwk_ObjLevel(pNext) )
                        LevelMax = Nwk_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
    {
        Nwk_ObjForEachFanin( pObj, pNext, i )
        {
            Nwk_ManLevel_rec( pNext );
            if ( LevelMax < Nwk_ObjLevel(pNext) )
                LevelMax = Nwk_ObjLevel(pNext);
        }
        if ( Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0 )
            LevelMax++;
    }
    else
        assert( 0 );
    Nwk_ObjSetLevel( pObj, LevelMax );
}